

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoaderUVW.h
# Opt level: O0

void __thiscall
chrono::ChLoaderUVWdistributed::ChLoaderUVWdistributed
          (ChLoaderUVWdistributed *this,shared_ptr<chrono::ChLoadableUVW> *mloadable)

{
  shared_ptr<chrono::ChLoadableUVW> local_28;
  shared_ptr<chrono::ChLoadableUVW> *local_18;
  shared_ptr<chrono::ChLoadableUVW> *mloadable_local;
  ChLoaderUVWdistributed *this_local;
  
  local_18 = mloadable;
  mloadable_local = (shared_ptr<chrono::ChLoadableUVW> *)this;
  std::shared_ptr<chrono::ChLoadableUVW>::shared_ptr(&local_28,mloadable);
  ChLoaderUVW::ChLoaderUVW(&this->super_ChLoaderUVW,&local_28);
  std::shared_ptr<chrono::ChLoadableUVW>::~shared_ptr(&local_28);
  (this->super_ChLoaderUVW).super_ChLoader._vptr_ChLoader =
       (_func_int **)&PTR__ChLoaderUVWdistributed_001c4058;
  return;
}

Assistant:

ChLoaderUVWdistributed(std::shared_ptr<ChLoadableUVW> mloadable) : ChLoaderUVW(mloadable) {}